

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav_ins.c
# Opt level: O1

void fsnav_ins_write_sensors(void)

{
  char *pcVar1;
  long lVar2;
  uint *puVar3;
  char sensors_file_token [12];
  char local_30 [16];
  
  builtin_strncpy(local_30,"sensors_out",0xc);
  if (fsnav->imu != (fsnav_imu *)0x0) {
    if (fsnav->mode == 0) {
      pcVar1 = fsnav_locate_token(local_30,fsnav->cfg,fsnav->cfglength,'=');
      if (pcVar1 != (char *)0x0) {
        __isoc99_sscanf(pcVar1,"%s",fsnav_ins_write_sensors::buffer);
      }
      fsnav_ins_write_sensors::fp = (FILE *)fopen(fsnav_ins_write_sensors::buffer,"w");
      if ((FILE *)fsnav_ins_write_sensors::fp == (FILE *)0x0) {
        printf("error: couldn\'t open output file \'%s\'.\n",fsnav_ins_write_sensors::buffer);
        fsnav->mode = -1;
      }
      else {
        fprintf((FILE *)fsnav_ins_write_sensors::fp,"%%");
        puVar3 = &DAT_0010d6e0;
        lVar2 = 0;
        do {
          fprintf((FILE *)fsnav_ins_write_sensors::fp,"%-*s ",(ulong)*puVar3,
                  (long)&DAT_0010d6c0 + (long)*(int *)((long)&DAT_0010d6c0 + lVar2));
          lVar2 = lVar2 + 4;
          puVar3 = puVar3 + 2;
        } while (lVar2 != 0x18);
      }
    }
    else if (fsnav->mode < 0) {
      if (fsnav_ins_write_sensors::fp != (FILE *)0x0) {
        fclose((FILE *)fsnav_ins_write_sensors::fp);
        return;
      }
    }
    else {
      fputc(10,(FILE *)fsnav_ins_write_sensors::fp);
      lVar2 = 0;
      do {
        fprintf((FILE *)fsnav_ins_write_sensors::fp,"%- *.*lf ",
                fsnav->imu->w[lVar2] * (fsnav->imu_const).rad2deg,
                (ulong)(uint)(&DAT_0010d6e0)[lVar2 * 2],(ulong)(uint)(&DAT_0010d6e4)[lVar2 * 2]);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
      lVar2 = 0;
      do {
        fprintf((FILE *)fsnav_ins_write_sensors::fp,"%- *.*lf ",fsnav->imu->f[lVar2],
                (ulong)(uint)(&DAT_0010d6f8)[lVar2 * 2],(ulong)(uint)(&DAT_0010d6fc)[lVar2 * 2]);
        lVar2 = lVar2 + 1;
      } while (lVar2 != 3);
    }
  }
  return;
}

Assistant:

void fsnav_ins_write_sensors(void)
{
	const char  sensors_file_token[] = "sensors_out";

	// заголовок в выходном файле + количество выводимых символов всего и после запятой, для каждого параметра по порядку
	const int   num_col  = 6;         
	const char *header[] = {"w1[d/s]", "w2[d/s]", "w3[d/s]", "f1[m/s^2]", "f2[m/s^2]", "f3[m/s^2]"};
	const int   fmt[]    = { 12,6,      12,6,      12,6,      12,6,        12,6,        12,6      };

	static FILE *fp = NULL;                    // указатель на файл
	static char  buffer[FSNAV_INS_BUFFER_SIZE]; // строковый буфер

	char *cfg_ptr; // указатель на параметр в строке конфигурации
	int   i, j;    // индексы

	// проверка инерциальной подсистемы на шине
	if (fsnav->imu == NULL)
		return;

	// инициализация частного алгоритма
	if (fsnav->mode == 0) {
		// поиск имени выходного файла в конфигурации
		cfg_ptr = fsnav_locate_token(sensors_file_token, fsnav->cfg, fsnav->cfglength, '=');
		if (cfg_ptr != NULL)
			sscanf(cfg_ptr, "%s", buffer);
		// открытие файла
		fp = fopen(buffer, "w");
		if (fp == NULL) {
			printf("error: couldn't open output file '%s'.\n", buffer);
			fsnav->mode = -1;
			return;
		}		
		// строка заголовка
		fprintf(fp, "%%");
		for (j = 0; j < num_col; j++)
			fprintf(fp, "%-*s ", fmt[2*j], header[j]);
	}

	// завершение работы
	else if (fsnav->mode < 0) {
		if (fp != NULL)
			fclose(fp);
		return;
	}

	// операции на каждом шаге
	else {
		j = 0;
		fprintf(fp, "\n");
		for (i = 0; i < 3; i++) fprintf(fp, "%- *.*lf ", fmt[j], fmt[j+1], fsnav->imu->w[i]*fsnav->imu_const.rad2deg), j += 2;
		for (i = 0; i < 3; i++) fprintf(fp, "%- *.*lf ", fmt[j], fmt[j+1], fsnav->imu->f[i]                        ), j += 2;
	}
}